

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsLoadGeometryStages::Read<tcu::Vector<float,4>>
          (BasicAllFormatsLoadGeometryStages *this,GLenum internalformat,Vector<float,_4> *value,
          Vector<float,_4> *expected_value)

{
  CallLogWrapper *this_00;
  void *this_01;
  _Alloc_hider _Var1;
  bool bVar2;
  GLuint program;
  GLint GVar3;
  ostream *poVar4;
  vec4 *epsilon;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  GLenum e_03;
  int i;
  long lVar5;
  char *pcVar6;
  GLuint i_2;
  ulong uVar7;
  undefined1 auVar8 [16];
  string local_2b8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  string local_278;
  vec4 zero;
  vec4 result;
  Context *local_208 [4];
  char *local_1e8 [4];
  char *local_1c8 [4];
  GLuint texture [8];
  
  this_01 = (void *)(ulong)internalformat;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)texture);
  poVar4 = std::operator<<((ostream *)texture,"#version 420 core\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2b8,this_01,e);
  poVar4 = std::operator<<(poVar4,(string *)&local_2b8);
  pcVar6 = ") readonly uniform ";
  poVar4 = std::operator<<(poVar4,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>((string *)&data,pcVar6);
  poVar4 = std::operator<<(poVar4,(string *)&data);
  pcVar6 = 
  "image2DArray g_image0;\nlayout(rgba32f) writeonly uniform image2D g_image0_result;\nvoid main() {\n  ivec3 coord = ivec3(gl_VertexID, 0, 0);\n  "
  ;
  poVar4 = std::operator<<(poVar4,
                           "image2DArray g_image0;\nlayout(rgba32f) writeonly uniform image2D g_image0_result;\nvoid main() {\n  ivec3 coord = ivec3(gl_VertexID, 0, 0);\n  "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>((string *)&zero,pcVar6);
  poVar4 = std::operator<<(poVar4,(string *)&zero);
  pcVar6 = "vec4 v = imageLoad(g_image0, coord);\n  if (v != ";
  poVar4 = std::operator<<(poVar4,"vec4 v = imageLoad(g_image0, coord);\n  if (v != ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_278,pcVar6);
  poVar4 = std::operator<<(poVar4,(string *)&local_278);
  poVar4 = std::operator<<(poVar4,"vec4");
  poVar4 = tcu::operator<<(poVar4,expected_value);
  std::operator<<(poVar4,
                  ") imageStore(g_image0_result, coord.xy, vec4(1.0, 0.0, 0.0, 1.0));\n  else imageStore(g_image0_result, coord.xy, vec4(0.0, 1.0, 0.0, 1.0));\n}"
                 );
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&zero);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)texture);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)texture);
  poVar4 = std::operator<<((ostream *)texture,
                           "#version 420 core\nlayout(vertices = 1) out;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2b8,this_01,e_00);
  poVar4 = std::operator<<(poVar4,(string *)&local_2b8);
  pcVar6 = ") readonly uniform ";
  poVar4 = std::operator<<(poVar4,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>((string *)&data,pcVar6);
  poVar4 = std::operator<<(poVar4,(string *)&data);
  pcVar6 = 
  "image2DArray g_image1;\nlayout(rgba32f) writeonly uniform image2D g_image1_result;\nvoid main() {\n  gl_TessLevelInner[0] = 1;\n  gl_TessLevelInner[1] = 1;\n  gl_TessLevelOuter[0] = 1;\n  gl_TessLevelOuter[1] = 1;\n  gl_TessLevelOuter[2] = 1;\n  gl_TessLevelOuter[3] = 1;\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  "
  ;
  poVar4 = std::operator<<(poVar4,
                           "image2DArray g_image1;\nlayout(rgba32f) writeonly uniform image2D g_image1_result;\nvoid main() {\n  gl_TessLevelInner[0] = 1;\n  gl_TessLevelInner[1] = 1;\n  gl_TessLevelOuter[0] = 1;\n  gl_TessLevelOuter[1] = 1;\n  gl_TessLevelOuter[2] = 1;\n  gl_TessLevelOuter[3] = 1;\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>((string *)&zero,pcVar6);
  poVar4 = std::operator<<(poVar4,(string *)&zero);
  pcVar6 = "vec4 v = imageLoad(g_image1, coord);\n  if (v != ";
  poVar4 = std::operator<<(poVar4,"vec4 v = imageLoad(g_image1, coord);\n  if (v != ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_278,pcVar6);
  poVar4 = std::operator<<(poVar4,(string *)&local_278);
  poVar4 = std::operator<<(poVar4,"vec4");
  poVar4 = tcu::operator<<(poVar4,expected_value);
  std::operator<<(poVar4,
                  ") imageStore(g_image1_result, coord.xy, vec4(1.0, 0.0, 0.0, 1.0));\n  else imageStore(g_image1_result, coord.xy, vec4(0.0, 1.0, 0.0, 1.0));\n}"
                 );
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&zero);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)texture);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)texture);
  poVar4 = std::operator<<((ostream *)texture,
                           "#version 420 core\nlayout(triangles, point_mode) in;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2b8,this_01,e_01);
  poVar4 = std::operator<<(poVar4,(string *)&local_2b8);
  pcVar6 = ") readonly uniform ";
  poVar4 = std::operator<<(poVar4,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>((string *)&data,pcVar6);
  poVar4 = std::operator<<(poVar4,(string *)&data);
  pcVar6 = 
  "image2DArray g_image2;\nlayout(rgba32f) writeonly uniform image2D g_image2_result;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  "
  ;
  poVar4 = std::operator<<(poVar4,
                           "image2DArray g_image2;\nlayout(rgba32f) writeonly uniform image2D g_image2_result;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>((string *)&zero,pcVar6);
  poVar4 = std::operator<<(poVar4,(string *)&zero);
  pcVar6 = "vec4 v = imageLoad(g_image2, coord);\n  if (v != ";
  poVar4 = std::operator<<(poVar4,"vec4 v = imageLoad(g_image2, coord);\n  if (v != ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_278,pcVar6);
  poVar4 = std::operator<<(poVar4,(string *)&local_278);
  poVar4 = std::operator<<(poVar4,"vec4");
  poVar4 = tcu::operator<<(poVar4,expected_value);
  std::operator<<(poVar4,
                  ") imageStore(g_image2_result, coord.xy, vec4(1.0, 0.0, 0.0, 1.0));\n  else imageStore(g_image2_result, coord.xy, vec4(0.0, 1.0, 0.0, 1.0));\n}"
                 );
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&zero);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)texture);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)texture);
  poVar4 = std::operator<<((ostream *)texture,
                           "#version 420 core\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout("
                          );
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2b8,this_01,e_02);
  poVar4 = std::operator<<(poVar4,(string *)&local_2b8);
  pcVar6 = ") readonly uniform ";
  poVar4 = std::operator<<(poVar4,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>((string *)&data,pcVar6);
  poVar4 = std::operator<<(poVar4,(string *)&data);
  pcVar6 = 
  "image2DArray g_image3;\nlayout(rgba32f) writeonly uniform image2D g_image3_result;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveIDIn, 0, 0);\n  "
  ;
  poVar4 = std::operator<<(poVar4,
                           "image2DArray g_image3;\nlayout(rgba32f) writeonly uniform image2D g_image3_result;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveIDIn, 0, 0);\n  "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>((string *)&zero,pcVar6);
  poVar4 = std::operator<<(poVar4,(string *)&zero);
  pcVar6 = "vec4 v = imageLoad(g_image3, coord);\n  if (v != ";
  poVar4 = std::operator<<(poVar4,"vec4 v = imageLoad(g_image3, coord);\n  if (v != ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_278,pcVar6);
  poVar4 = std::operator<<(poVar4,(string *)&local_278);
  poVar4 = std::operator<<(poVar4,"vec4");
  poVar4 = tcu::operator<<(poVar4,expected_value);
  std::operator<<(poVar4,
                  ") imageStore(g_image3_result, coord.xy, vec4(1.0, 0.0, 0.0, 1.0));\n  else imageStore(g_image3_result, coord.xy, vec4(0.0, 1.0, 0.0, 1.0));\n}"
                 );
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&zero);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)texture);
  program = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                      ((ShaderImageLoadStoreBase *)this,(char *)result.m_data._0_8_,local_1c8[0],
                       local_1e8[0],(char *)local_208[0],(char *)0x0,(bool *)0x0);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::~string((string *)&result);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,1,value,(allocator_type *)texture);
  this_00 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(this_00,8,texture);
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,texture[lVar5]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x8c1a,0,internalformat,1,1,1,0,0x1908,0x1406,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
  }
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&zero,0.0);
  for (lVar5 = 4; lVar5 != 8; lVar5 = lVar5 + 1) {
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[lVar5]);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8814,1,1,0,0x1908,0x1406,(string *)&zero);
  }
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image0");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,0);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image1");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,1);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image2");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,2);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image3");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,3);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image0_result");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,4);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image1_result");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,5);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image2_result");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,6);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image3_result");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,7);
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    glu::CallLogWrapper::glBindImageTexture
              (this_00,(GLuint)lVar5,texture[lVar5],0,'\x01',0,35000,internalformat);
  }
  for (lVar5 = 4; lVar5 != 8; lVar5 = lVar5 + 1) {
    glu::CallLogWrapper::glBindImageTexture
              (this_00,(GLuint)lVar5,texture[lVar5],0,'\0',0,0x88b9,0x8814);
  }
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,1);
  glu::CallLogWrapper::glDrawArrays(this_00,0xe,0,1);
  glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,3);
  lVar5 = (**(code **)(**(long **)(*(long *)(this + 0x20) + 8) + 0x20))();
  auVar8._0_4_ = (float)(int)(float)(*(int *)(lVar5 + 8) * 0x800000 + 0x3f800000);
  auVar8._4_4_ = (float)(int)(float)(*(int *)(lVar5 + 0xc) * 0x800000 + 0x3f800000);
  auVar8._8_4_ = (float)(int)(float)(*(int *)(lVar5 + 0x10) * 0x800000 + 0x3f800000);
  auVar8._12_4_ = (float)(int)(float)(*(int *)(lVar5 + 0x14) * 0x800000 + 0x3f800000);
  local_278._0_16_ = divps(_DAT_01675840,auVar8);
  uVar7 = 0;
  do {
    if (uVar7 == 4) {
      glu::CallLogWrapper::glDeleteTextures(this_00,8,texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
LAB_00a37c12:
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      return 3 < uVar7;
    }
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[uVar7 + 4]);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&result);
    epsilon = (vec4 *)0x1908;
    glu::CallLogWrapper::glGetTexImage
              (this_00,0xde1,0,0x1908,0x1406,(ShaderImageLoadStoreBase *)&result);
    local_2b8._M_dataplus._M_p = (pointer)0x3f80000000000000;
    local_2b8._M_string_length = 0x3f80000000000000;
    bVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ColorEqual
                      ((ShaderImageLoadStoreBase *)&result,(vec4 *)&local_2b8,(vec4 *)&local_278,
                       epsilon);
    if (!bVar2) {
      glu::CallLogWrapper::glDeleteTextures(this_00,8,texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2b8,this_01,e_03);
      _Var1._M_p = local_2b8._M_dataplus._M_p;
      pcVar6 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                         ((ShaderImageLoadStoreBase *)(uVar7 & 0xffffffff),internalformat);
      gl4cts::anon_unknown_0::Output
                ("Bad load value. Format is: %s. Stage is: %s.\n",_Var1._M_p,pcVar6);
      std::__cxx11::string::~string((string *)&local_2b8);
      goto LAB_00a37c12;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value)
	{
		const GLuint program = BuildProgram(
			GenVS(internalformat, expected_value).c_str(), GenTCS(internalformat, expected_value).c_str(),
			GenTES(internalformat, expected_value).c_str(), GenGS(internalformat, expected_value).c_str(), NULL);
		const int	  kSize = 1;
		std::vector<T> data(kSize * kSize, value);
		GLuint		   texture[8];
		glGenTextures(8, texture);

		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(GL_TEXTURE_2D_ARRAY, texture[i]);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, internalformat, kSize, kSize, 1, 0, Format<T>(), Type<T>(), &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);
		vec4 zero(0);
		for (int i = 4; i < 8; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, texture[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kSize, kSize, 0, GL_RGBA, GL_FLOAT, &zero);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image0"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image1"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image2"), 2);
		glUniform1i(glGetUniformLocation(program, "g_image3"), 3);
		glUniform1i(glGetUniformLocation(program, "g_image0_result"), 4);
		glUniform1i(glGetUniformLocation(program, "g_image1_result"), 5);
		glUniform1i(glGetUniformLocation(program, "g_image2_result"), 6);
		glUniform1i(glGetUniformLocation(program, "g_image3_result"), 7);

		for (GLuint i = 0; i < 4; ++i)
		{
			glBindImageTexture(i, texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		}
		for (GLuint i = 4; i < 8; ++i)
		{
			glBindImageTexture(i, texture[i], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		}
		glBindVertexArray(m_vao);
		glPatchParameteri(GL_PATCH_VERTICES, 1);
		glDrawArrays(GL_PATCHES, 0, 1);
		glPatchParameteri(GL_PATCH_VERTICES, 3);

		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		vec4					 g_color_eps  = vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, texture[i + 4]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			vec4 result;
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &result[0]);
			if (!ColorEqual(result, vec4(0, 1, 0, 1), g_color_eps))
			{
				glDeleteTextures(8, texture);
				glUseProgram(0);
				glDeleteProgram(program);
				Output("Bad load value. Format is: %s. Stage is: %s.\n", FormatEnumToString(internalformat).c_str(),
					   StageName(i));
				return false;
			}
		}
		glDeleteTextures(8, texture);
		glUseProgram(0);
		glDeleteProgram(program);
		return true;
	}